

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::SkipComment(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
              *this)

{
  bool bVar1;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  bVar1 = Symbol_(this,&m_multiline_comment_begin);
  if (bVar1) {
    while ((bVar1 = Position::has_more(&this->m_position), bVar1 &&
           (bVar1 = Symbol_(this,&m_multiline_comment_end), !bVar1))) {
      bVar1 = Eol_(this,false);
      if (!bVar1) {
        Position::operator++(&this->m_position);
      }
    }
    this_local._7_1_ = true;
  }
  else {
    bVar1 = Symbol_(this,&m_singleline_comment);
    if (bVar1) {
      while (bVar1 = Position::has_more(&this->m_position), bVar1) {
        bVar1 = Symbol_(this,&m_cr_lf);
        if (bVar1) {
          Position::operator-=(&this->m_position,2);
          break;
        }
        bVar1 = Char_(this,'\n');
        if (bVar1) {
          Position::operator--(&this->m_position);
          break;
        }
        Position::operator++(&this->m_position);
      }
      this_local._7_1_ = true;
    }
    else {
      bVar1 = Symbol_(this,&m_annotation);
      if (bVar1) {
        while (bVar1 = Position::has_more(&this->m_position), bVar1) {
          bVar1 = Symbol_(this,&m_cr_lf);
          if (bVar1) {
            Position::operator-=(&this->m_position,2);
            break;
          }
          bVar1 = Char_(this,'\n');
          if (bVar1) {
            Position::operator--(&this->m_position);
            break;
          }
          Position::operator++(&this->m_position);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SkipComment() {
        if (Symbol_(m_multiline_comment_begin)) {
          while (m_position.has_more()) {
            if (Symbol_(m_multiline_comment_end)) {
              break;
            } else if (!Eol_()) {
              ++m_position;
            }
          }
          return true;
        } else if (Symbol_(m_singleline_comment)) {
          while (m_position.has_more()) {
            if (Symbol_(m_cr_lf)) {
              m_position -= 2;
              break;
            } else if (Char_('\n')) {
              --m_position;
              break;
            } else {
              ++m_position;
            }
          }
          return true;
        } else if (Symbol_(m_annotation)) {
          while (m_position.has_more()) {
            if (Symbol_(m_cr_lf)) {
              m_position -= 2;
              break;
            } else if (Char_('\n')) {
              --m_position;
              break;
            } else {
              ++m_position;
            }
          }
          return true;
        }
        return false;
      }